

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::
NameResolverTest_NestInFileClassServiceEdition2024_Test::TestBody
          (NameResolverTest_NestInFileClassServiceEdition2024_Test *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  long *plVar3;
  FileDescriptor *this_00;
  ServiceDescriptor *descriptor;
  ServiceDescriptor *descriptor_00;
  char *pcVar4;
  string_view filename;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view contents;
  ClassNameResolver resolver;
  AssertHelper local_f0;
  internal local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  undefined1 local_d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined2 local_90;
  ClassNameResolver local_88;
  
  filename._M_str = "foo.proto";
  filename._M_len = 9;
  contents._M_str =
       "\n      edition = \"2024\";\n      import \"third_party/java/protobuf/java_features.proto\";\n      package proto2_unittest;\n      option java_generic_services = true;\n      message Dummy {}\n      service NestedInFileClassService {\n        option features.(pb.java).nest_in_file_class = YES;\n        rpc Method(Dummy) returns (Dummy) {}\n      }\n      service UnnestedService {\n        rpc Method(Dummy) returns (Dummy) {}\n      }\n                "
  ;
  contents._M_len = 0x1b7;
  NameResolverTest::BuildFileAndPopulatePool(&this->super_NameResolverTest,filename,contents);
  local_d8[0] = false;
  local_d8[1] = false;
  local_d8[2] = false;
  local_d8[3] = false;
  local_d8[4] = true;
  local_d8[5] = false;
  local_d8._16_8_ = 0;
  local_c0._M_local_buf[0] = '\0';
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90._0_1_ = false;
  local_90._1_1_ = true;
  local_d8._8_8_ = &local_c0;
  local_b0._M_p = (pointer)&local_a0;
  ClassNameResolver::ClassNameResolver(&local_88,(Options *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,
                    CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._8_8_ != &local_c0) {
    operator_delete((void *)local_d8._8_8_,
                    CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) + 1);
  }
  name._M_str = "foo.proto";
  name._M_len = 9;
  this_00 = DescriptorPool::FindFileByName(&(this->super_NameResolverTest).pool_,name);
  name_00._M_str = "NestedInFileClassService";
  name_00._M_len = 0x18;
  descriptor = FileDescriptor::FindServiceByName(this_00,name_00);
  name_01._M_str = "UnnestedService";
  name_01._M_len = 0xf;
  descriptor_00 = FileDescriptor::FindServiceByName(this_00,name_01);
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_d8,&local_88,descriptor_00,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[32]>
            (local_e8,"resolver.GetClassName(unnested_service, true)",
             "\"\" \"proto2_unittest.UnnestedService\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [32])"proto2_unittest.UnnestedService");
  puVar1 = local_d8 + 0x10;
  puVar2 = (undefined1 *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
  if (puVar2 != puVar1) {
    operator_delete(puVar2,local_d8._16_8_ + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xd7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar3 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_d8,&local_88,descriptor,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[50]>
            (local_e8,"resolver.GetClassName(nested_service, true)",
             "\"\" \"proto2_unittest.FooProto.NestedInFileClassService\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [50])"proto2_unittest.FooProto.NestedInFileClassService");
  puVar2 = (undefined1 *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
  if (puVar2 != puVar1) {
    operator_delete(puVar2,local_d8._16_8_ + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xda,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar3 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_
            ((string *)local_d8,&local_88,descriptor_00);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[32]>
            (local_e8,"resolver.GetJavaImmutableClassName(unnested_service)",
             "\"\" \"proto2_unittest.UnnestedService\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [32])"proto2_unittest.UnnestedService");
  puVar2 = (undefined1 *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
  if (puVar2 != puVar1) {
    operator_delete(puVar2,local_d8._16_8_ + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xdc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar3 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_((string *)local_d8,&local_88,descriptor);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[50]>
            (local_e8,"resolver.GetJavaImmutableClassName(nested_service)",
             "\"\" \"proto2_unittest.FooProto$NestedInFileClassService\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [50])"proto2_unittest.FooProto$NestedInFileClassService");
  puVar2 = (undefined1 *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
  if (puVar2 != puVar1) {
    operator_delete(puVar2,local_d8._16_8_ + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xde,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar3 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  ClassNameResolver::~ClassNameResolver(&local_88);
  return;
}

Assistant:

TEST_F(NameResolverTest, NestInFileClassServiceEdition2024) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2024";
      import "third_party/java/protobuf/java_features.proto";
      package proto2_unittest;
      option java_generic_services = true;
      message Dummy {}
      service NestedInFileClassService {
        option features.(pb.java).nest_in_file_class = YES;
        rpc Method(Dummy) returns (Dummy) {}
      }
      service UnnestedService {
        rpc Method(Dummy) returns (Dummy) {}
      }
                )schema");
  ClassNameResolver resolver;
  auto file = pool_.FindFileByName("foo.proto");
  auto nested_service = file->FindServiceByName("NestedInFileClassService");
  auto unnested_service = file->FindServiceByName("UnnestedService");

  EXPECT_EQ(resolver.GetClassName(unnested_service,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.UnnestedService");
  EXPECT_EQ(resolver.GetClassName(nested_service,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.FooProto.NestedInFileClassService");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(unnested_service),
            PACKAGE_PREFIX "proto2_unittest.UnnestedService");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nested_service),
            PACKAGE_PREFIX "proto2_unittest.FooProto$NestedInFileClassService");
}